

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O0

opj_image_t * pngtoimage(char *read_idf,opj_cparameters_t *params)

{
  size_t sVar1;
  opj_image_t *local_60;
  opj_image_t *image;
  OPJ_BYTE sigbuf [8];
  OPJ_INT32 *row32s;
  OPJ_BYTE **rows;
  FILE *reader;
  png_uint_32 height;
  OPJ_UINT32 i;
  png_infop info;
  png_structp png;
  opj_cparameters_t *params_local;
  char *read_idf_local;
  
  info = (png_infop)0x0;
  _height = (png_infop)0x0;
  reader._0_4_ = 0;
  rows = (OPJ_BYTE **)0x0;
  row32s = (OPJ_INT32 *)0x0;
  sigbuf[0] = '\0';
  sigbuf[1] = '\0';
  sigbuf[2] = '\0';
  sigbuf[3] = '\0';
  sigbuf[4] = '\0';
  sigbuf[5] = '\0';
  sigbuf[6] = '\0';
  sigbuf[7] = '\0';
  local_60 = (opj_image_t *)0x0;
  png = (png_structp)params;
  params_local = (opj_cparameters_t *)read_idf;
  rows = (OPJ_BYTE **)fopen(read_idf,"rb");
  if ((FILE *)rows == (FILE *)0x0) {
    fprintf(_stderr,"pngtoimage: can not open %s\n",params_local);
    read_idf_local = (char *)0x0;
  }
  else {
    sVar1 = fread(&image,1,8,(FILE *)rows);
    if ((sVar1 == 8) && (image == (opj_image_t *)0xa1a0a0d474e5089)) {
      info = (png_infop)png_create_read_struct("1.6.37",0,0);
      if ((info != (png_infop)0x0) &&
         (_height = (png_infop)png_create_info_struct(info), _height != (png_infop)0x0)) {
        local_60 = pngtoimage_internal((opj_cparameters_t *)png,(FILE *)rows,(png_structp)info,
                                       _height,(png_uint_32 *)&reader,(OPJ_BYTE ***)&row32s,
                                       (OPJ_INT32 **)sigbuf);
      }
    }
    else {
      fprintf(_stderr,"pngtoimage: %s is no valid PNG file\n",params_local);
    }
    if (row32s != (OPJ_INT32 *)0x0) {
      for (reader._4_4_ = 0; reader._4_4_ < (uint)reader; reader._4_4_ = reader._4_4_ + 1) {
        if (*(long *)(row32s + (ulong)reader._4_4_ * 2) != 0) {
          free(*(void **)(row32s + (ulong)reader._4_4_ * 2));
        }
      }
      free(row32s);
    }
    if (sigbuf != (OPJ_BYTE  [8])0x0) {
      free((void *)sigbuf);
    }
    if (info != (png_infop)0x0) {
      png_destroy_read_struct(&info,&height,0);
    }
    fclose((FILE *)rows);
    read_idf_local = (char *)local_60;
  }
  return (opj_image_t *)read_idf_local;
}

Assistant:

opj_image_t *pngtoimage(const char *read_idf, opj_cparameters_t * params)
{
    png_structp  png = NULL;
    png_infop    info = NULL;
    OPJ_UINT32 i;
    png_uint_32  height = 0U;
    FILE *reader = NULL;
    OPJ_BYTE** rows = NULL;
    OPJ_INT32* row32s = NULL;
    OPJ_BYTE sigbuf[8];
    opj_image_t *image = NULL;

    if ((reader = fopen(read_idf, "rb")) == NULL) {
        fprintf(stderr, "pngtoimage: can not open %s\n", read_idf);
        return NULL;
    }

    if (fread(sigbuf, 1, MAGIC_SIZE, reader) != MAGIC_SIZE
            || memcmp(sigbuf, PNG_MAGIC, MAGIC_SIZE) != 0) {
        fprintf(stderr, "pngtoimage: %s is no valid PNG file\n", read_idf);
        goto fin;
    }

    if ((png = png_create_read_struct(PNG_LIBPNG_VER_STRING,
                                      NULL, NULL, NULL)) == NULL) {
        goto fin;
    }
    if ((info = png_create_info_struct(png)) == NULL) {
        goto fin;
    }

    image = pngtoimage_internal(params, reader, png, info, &height, &rows, &row32s);
fin:
    if (rows) {
        for (i = 0; i < height; ++i)
            if (rows[i]) {
                free(rows[i]);
            }
        free(rows);
    }
    if (row32s) {
        free(row32s);
    }
    if (png) {
        png_destroy_read_struct(&png, &info, NULL);
    }

    fclose(reader);

    return image;

}